

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O2

void artifact_score(obj *list,boolean counting,menulist *menu)

{
  int iVar1;
  boolean bVar2;
  long amount;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  nh_menuitem *pnVar6;
  int iVar7;
  char *pcVar8;
  short dummy;
  char pbuf [256];
  
  for (; list != (obj *)0x0; list = list->nobj) {
    if (((list->oartifact != '\0') || ((ushort)list->otyp - 0x10b < 2)) || (list->otyp == 0x1bd)) {
      amount = arti_cost(list);
      lVar3 = (amount * 5) / 2;
      if (counting == '\0') {
        discover_object((int)list->otyp,'\x01','\x01');
        list->field_0x4a = list->field_0x4a | 0xf0;
        bVar2 = the_unique_obj(list);
        pcVar8 = "The ";
        if (bVar2 == '\0') {
          pcVar8 = "";
        }
        if (list->oartifact == '\0') {
          pcVar4 = obj_descr[objects[list->otyp].oc_name_idx].oc_name;
        }
        else {
          pcVar4 = xname(list);
          pcVar4 = artifact_name(pcVar4,&dummy);
        }
        pcVar5 = currency(amount);
        sprintf(pbuf,"%s%s (worth %ld %s and %ld points)",pcVar8,pcVar4,amount,pcVar5,lVar3);
        iVar7 = menu->icount;
        iVar1 = menu->size;
        pnVar6 = menu->items;
        if (iVar1 <= iVar7) {
          menu->size = iVar1 * 2;
          pnVar6 = (nh_menuitem *)realloc(pnVar6,(long)iVar1 * 0x218);
          menu->items = pnVar6;
          iVar7 = menu->icount;
        }
        pnVar6 = pnVar6 + iVar7;
        pnVar6->id = 0;
        pnVar6->role = MI_TEXT;
        pnVar6->accel = '\0';
        pnVar6->group_accel = '\0';
        pnVar6->selected = '\0';
        strcpy(pnVar6->caption,pbuf);
        menu->icount = menu->icount + 1;
      }
      else {
        u.urscore = u.urscore + (int)lVar3;
      }
    }
    if (list->cobj != (obj *)0x0) {
      artifact_score(list->cobj,counting,menu);
    }
  }
  return;
}

Assistant:

static void artifact_score(struct obj *list,
			   boolean counting, /* true => add up points; false => display them */
			   struct menulist *menu)
{
    char pbuf[BUFSZ];
    struct obj *otmp;
    long value, points;
    short dummy;	/* object type returned by artifact_name() */

    for (otmp = list; otmp; otmp = otmp->nobj) {
	if (otmp->oartifact ||
			otmp->otyp == BELL_OF_OPENING ||
			otmp->otyp == SPE_BOOK_OF_THE_DEAD ||
			otmp->otyp == CANDELABRUM_OF_INVOCATION) {
	    value = arti_cost(otmp);	/* zorkmid value */
	    points = value * 5 / 2;	/* score value */
	    if (counting) {
		u.urscore += points;
	    } else {
		makeknown(otmp->otyp);
		otmp->known = otmp->dknown = otmp->bknown = otmp->rknown = 1;
		/* assumes artifacts don't have quan > 1 */
		sprintf(pbuf, "%s%s (worth %ld %s and %ld points)",
			the_unique_obj(otmp) ? "The " : "",
			otmp->oartifact ? artifact_name(xname(otmp), &dummy) :
				OBJ_NAME(objects[otmp->otyp]),
			value, currency(value), points);
		add_menutext(menu, pbuf);
	    }
	}
	if (Has_contents(otmp))
	    artifact_score(otmp->cobj, counting, menu);
    }
}